

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall Array::~Array(Array *this)

{
  int local_14;
  int i;
  Array *this_local;
  
  this->_vptr_Array = (_func_int **)&PTR__Array_00104d08;
  for (local_14 = 0; local_14 < this->_height; local_14 = local_14 + 1) {
    if (this->_data[local_14] != (int *)0x0) {
      operator_delete__(this->_data[local_14]);
    }
  }
  if (this->_data != (int **)0x0) {
    operator_delete__(this->_data);
  }
  return;
}

Assistant:

Array::~Array()
{
	for (int i = 0; i < _height; ++i) {
			delete[] _data[i];
	}

	delete[] _data;
}